

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix)

{
  size_t *this_00;
  cmGeneratorTarget *headTarget;
  cmGeneratorTarget *currentTarget;
  bool bVar1;
  TargetType TVar2;
  cmExportSet *this_01;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *this_02;
  reference this_03;
  pointer pcVar3;
  ulong uVar4;
  cmLocalGenerator *lg;
  string_view str;
  string local_190;
  string_view local_170;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  string importedXcFrameworkLocation;
  cmGeneratorTarget *gtgt;
  undefined1 local_a8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  ImportPropertyMap properties;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *te;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *__range1;
  string *suffix_local;
  string *config_local;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  this_01 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  this_02 = cmExportSet::GetTargetExports(this_01);
  __end1 = std::
           vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ::begin(this_02);
  te = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
       std::
       vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
       ::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                                *)&te);
    if (!bVar1) break;
    this_03 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
              ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::get(this_03);
    TVar2 = GetExportTargetType(this,pcVar3);
    if (TVar2 != INTERFACE_LIBRARY) {
      this_00 = &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_00);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
      pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (this_03);
      SetImportLocationProperty
                (this,config,suffix,pcVar3->ArchiveGenerator,(ImportPropertyMap *)this_00,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (this_03);
      SetImportLocationProperty
                (this,config,suffix,pcVar3->LibraryGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (this_03);
      SetImportLocationProperty
                (this,config,suffix,pcVar3->RuntimeGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (this_03);
      SetImportLocationProperty
                (this,config,suffix,pcVar3->ObjectsGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (this_03);
      SetImportLocationProperty
                (this,config,suffix,pcVar3->FrameworkGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                         (this_03);
      SetImportLocationProperty
                (this,config,suffix,pcVar3->BundleGenerator,
                 (ImportPropertyMap *)
                 &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      bVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar1) {
        pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                           (this_03);
        importedXcFrameworkLocation.field_2._8_8_ = pcVar3->Target;
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,
                   (cmGeneratorTarget *)importedXcFrameworkLocation.field_2._8_8_,
                   (ImportPropertyMap *)
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,
                   (cmGeneratorTarget *)importedXcFrameworkLocation.field_2._8_8_,
                   (ImportPropertyMap *)
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                           (this_03);
        std::__cxx11::string::string((string *)local_e0,(string *)&pcVar3->XcFrameworkLocation);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          cmGeneratorExpression::Preprocess(&local_100,(string *)local_e0,InstallInterface,true);
          std::__cxx11::string::operator=((string *)local_e0,(string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::string((string *)&local_140,(string *)local_e0);
          pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                             (this_03);
          lg = cmGeneratorTarget::GetLocalGenerator(pcVar3->Target);
          pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                             (this_03);
          headTarget = pcVar3->Target;
          pcVar3 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                             (this_03);
          currentTarget = pcVar3->Target;
          std::__cxx11::string::string((string *)&local_160);
          cmGeneratorExpression::Evaluate
                    (&local_120,&local_140,lg,config,headTarget,
                     (cmGeneratorExpressionDAGChecker *)0x0,currentTarget,&local_160);
          std::__cxx11::string::operator=((string *)local_e0,(string *)&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_140);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_e0);
            if (!bVar1) {
              str = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e0);
              local_170 = str;
              bVar1 = cmHasLiteralPrefix<19ul>(str,(char (*) [19])"${_IMPORT_PREFIX}/");
              if (!bVar1) {
                cmStrCat<char_const(&)[19],std::__cxx11::string&>
                          (&local_190,(char (*) [19])"${_IMPORT_PREFIX}/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0);
                std::__cxx11::string::operator=((string *)local_e0,(string *)&local_190);
                std::__cxx11::string::~string((string *)&local_190);
              }
            }
          }
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                  (this,os,config,suffix,importedXcFrameworkLocation.field_2._8_8_,
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,local_e0);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                  (this,os,importedXcFrameworkLocation.field_2._8_8_,
                   &importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,local_a8,
                   local_e0);
        std::__cxx11::string::~string((string *)local_e0);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  // Add each target in the set to the export.
  for (std::unique_ptr<cmTargetExport> const& te :
       this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (this->GetExportTargetType(te.get()) ==
        cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties);

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      std::string importedXcFrameworkLocation = te->XcFrameworkLocation;
      if (!importedXcFrameworkLocation.empty()) {
        importedXcFrameworkLocation = cmGeneratorExpression::Preprocess(
          importedXcFrameworkLocation,
          cmGeneratorExpression::PreprocessContext::InstallInterface, true);
        importedXcFrameworkLocation = cmGeneratorExpression::Evaluate(
          importedXcFrameworkLocation, te->Target->GetLocalGenerator(), config,
          te->Target, nullptr, te->Target);
        if (!importedXcFrameworkLocation.empty() &&
            !cmSystemTools::FileIsFullPath(importedXcFrameworkLocation) &&
            !cmHasLiteralPrefix(importedXcFrameworkLocation,
                                "${_IMPORT_PREFIX}/")) {
          importedXcFrameworkLocation =
            cmStrCat("${_IMPORT_PREFIX}/", importedXcFrameworkLocation);
        }
      }
      this->GenerateImportPropertyCode(os, config, suffix, gtgt, properties,
                                       importedXcFrameworkLocation);
      this->GenerateImportedFileChecksCode(
        os, gtgt, properties, importedLocations, importedXcFrameworkLocation);
    }
  }
}